

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O2

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_openBase
                   (uint8_t *pkE,uint8_t *skR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t ctlen,uint8_t *ct,uint8_t *o_pt)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  uint32_t uVar1;
  uint uVar2;
  uint64_t ctx_seq;
  uint8_t ctx_nonce [12];
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t local_84 [4];
  ulong local_80;
  uint8_t ctx_key [32];
  uint8_t ctx_exporter [64];
  
  ctx_nonce[8] = '\0';
  ctx_nonce[9] = '\0';
  ctx_nonce[10] = '\0';
  ctx_nonce[0xb] = '\0';
  ctx_nonce[0] = '\0';
  ctx_nonce[1] = '\0';
  ctx_nonce[2] = '\0';
  ctx_nonce[3] = '\0';
  ctx_nonce[4] = '\0';
  ctx_nonce[5] = '\0';
  ctx_nonce[6] = '\0';
  ctx_nonce[7] = '\0';
  ctx_seq = 0;
  ctx_key = (uint8_t  [32])ZEXT1632(ZEXT816(0) << 0x40);
  ctx_exporter._0_32_ = ZEXT1632(ZEXT816(0) << 0x40);
  o_ctx_00.ctx_nonce = ctx_nonce;
  o_ctx_00.ctx_key = ctx_key;
  o_ctx_00.ctx_seq = &ctx_seq;
  o_ctx_00.ctx_exporter = ctx_exporter;
  ctx_exporter._32_32_ = (undefined1  [32])ctx_key;
  uVar1 = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx_00,pkE,skR,infolen,info);
  if (uVar1 == 0) {
    local_84[0] = ctx_nonce[0];
    local_84[1] = ctx_nonce[1];
    local_84[2] = ctx_nonce[2];
    local_84[3] = ctx_nonce[3];
    local_80 = (ctx_seq >> 0x38 | (ctx_seq & 0xff000000000000) >> 0x28 |
                (ctx_seq & 0xff0000000000) >> 0x18 | (ctx_seq & 0xff00000000) >> 8 |
                (ctx_seq & 0xff000000) << 8 | (ctx_seq & 0xff0000) << 0x18 |
                (ctx_seq & 0xff00) << 0x28 | ctx_seq << 0x38) ^
               CONCAT44(ctx_nonce._8_4_,ctx_nonce._4_4_);
    uVar1 = Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt
                      (o_pt,ct,ctlen - 0x10,aad,aadlen,ctx_key,local_84,ct + ((ulong)ctlen - 0x10));
    uVar2 = (uint)(ctx_seq == 0xffffffffffffffff || uVar1 != 0);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_openBase(
  uint8_t *pkE,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t ctlen,
  uint8_t *ct,
  uint8_t *o_pt
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[64U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx, pkE, skR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = ct;
    uint8_t *tag = ct + ctlen - 16U;
    uint32_t
    res1 =
      Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt(o_pt,
        cipher,
        ctlen - 16U,
        aad,
        aadlen,
        o_ctx.ctx_key,
        nonce,
        tag);
    if (res1 == 0U)
    {
      uint64_t s1 = o_ctx.ctx_seq[0U];
      if (s1 == 18446744073709551615ULL)
      {
        return 1U;
      }
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}